

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O0

Object * __thiscall
flatbuffers::BaseBfbsGenerator::GetObjectByIndex(BaseBfbsGenerator *this,int32_t index)

{
  uint uVar1;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar2;
  return_type pOVar3;
  int32_t index_local;
  BaseBfbsGenerator *this_local;
  
  if ((this->schema_ != (Schema *)0x0) && (-1 < index)) {
    pVVar2 = reflection::Schema::objects(this->schema_);
    uVar1 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::size(pVVar2);
    if (index < (int)uVar1) {
      pVVar2 = reflection::Schema::objects(this->schema_);
      pOVar3 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get(pVVar2,index);
      return pOVar3;
    }
  }
  return (Object *)0x0;
}

Assistant:

const reflection::Object *GetObjectByIndex(int32_t index) const {
    if (!schema_ || index < 0 ||
        index >= static_cast<int32_t>(schema_->objects()->size())) {
      return nullptr;
    }
    return schema_->objects()->Get(index);
  }